

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopLoopBlock(cmMakefile *this)

{
  bool bVar1;
  reference pvVar2;
  cmMakefile *this_local;
  
  bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty(&this->LoopBlockCounter);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->LoopBlockCounter.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                  ,0xb77,"void cmMakefile::PopLoopBlock()");
  }
  pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->LoopBlockCounter);
  if (0 < *pvVar2) {
    pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->LoopBlockCounter);
    *pvVar2 = *pvVar2 + -1;
    return;
  }
  __assert_fail("this->LoopBlockCounter.top() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                ,0xb78,"void cmMakefile::PopLoopBlock()");
}

Assistant:

void cmMakefile::PopLoopBlock()
{
  assert(!this->LoopBlockCounter.empty());
  assert(this->LoopBlockCounter.top() > 0);
  this->LoopBlockCounter.top()--;
}